

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

Var Js::JavascriptBigInt::Negate(Var aRight)

{
  JavascriptBigInt *pJVar1;
  ScriptContext *scriptContext;
  JavascriptBigInt *newBigInt;
  JavascriptBigInt *rightBigInt;
  Var aRight_local;
  
  pJVar1 = VarTo<Js::JavascriptBigInt>(aRight);
  scriptContext = RecyclableObject::GetScriptContext(&pJVar1->super_RecyclableObject);
  pJVar1 = New(pJVar1,scriptContext);
  Negate(pJVar1);
  return pJVar1;
}

Assistant:

Var JavascriptBigInt::Negate(Var aRight)
    {
        JavascriptBigInt* rightBigInt = VarTo<JavascriptBigInt>(aRight);
        JavascriptBigInt* newBigInt = JavascriptBigInt::New(rightBigInt, rightBigInt->GetScriptContext());
        JavascriptBigInt::Negate(newBigInt);
        return newBigInt;
    }